

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall
FIX::ScreenLogFactory::ScreenLogFactory(ScreenLogFactory *this,SessionSettings *settings)

{
  *(undefined **)this = &Message::typeinfo;
  this[0xb] = (ScreenLogFactory)0x1;
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x10),settings);
  return;
}

Assistant:

ScreenLogFactory( const SessionSettings& settings )
: m_useSettings( true ), m_settings( settings ) {}